

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_experimental.c
# Opt level: O1

char * experimental_all_tests(void)

{
  int iVar1;
  vector3 out_scale;
  vector3 out_translation;
  vector3 in_translation;
  quaternion out_rotation;
  matrix4 t;
  vector3 vStack_118;
  vector3 local_100;
  anon_union_24_3_07544b15_for_vector3_0 local_e8;
  quaternion local_d0;
  matrix4 local_b0;
  
  local_e8.v[0] = 1.0;
  local_e8.v[1] = 2.0;
  local_e8.v[2] = 3.0;
  matrix4_make_transformation_translationv3(&local_b0,(vector3 *)&local_e8.field_1);
  matrix4_transformation_decompose_EXP(&local_b0,&vStack_118,&local_d0,&local_100);
  iVar1 = vector3_equals((vector3 *)&local_e8.field_1,&local_100);
  tests_run = tests_run + 1;
  test_message = (char *)0x0;
  if (iVar1 == 0) {
    test_message = 
    "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_experimental.c(21) : (assertion failed) ((vector3_equals(&in_translation, &out_translation)))"
    ;
  }
  else {
    local_e8.v[0] = 1.0;
    local_e8.v[1] = 2.0;
    local_e8.v[2] = 3.0;
    matrix4_make_transformation_scalingv3(&local_b0,(vector3 *)&local_e8.field_1);
    matrix4_transformation_decompose_EXP(&local_b0,&vStack_118,&local_d0,&local_100);
    iVar1 = vector3_equals((vector3 *)&local_e8.field_1,&vStack_118);
    test_message = (char *)0x0;
    if (iVar1 == 0) {
      test_message = 
      "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_experimental.c(44) : (assertion failed) ((vector3_equals(&in_scale, &out_scale)))"
      ;
    }
    tests_run = tests_run + 1;
  }
  return test_message;
}

Assistant:

static char *experimental_all_tests(void)
{
	run_test(test_matrix4_transformation_decompose_translation);
	run_test(test_matrix4_transformation_decompose_scaling);

	return NULL;
}